

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall kratos::IRVisitor::visit_root(IRVisitor *this,IRNode *root)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  int iVar4;
  _Hash_node_base *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __node_base_ptr p_Var5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  __hash_code __code;
  ulong uVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  pair<std::__detail::_Node_iterator<kratos::IRNode_*,_true,_false>,_bool> pVar9;
  _Hash_node_base *local_38;
  IRNode *child;
  
  local_38 = in_RAX;
  (**root->_vptr_IRNode)(root,this);
  this->level = this->level + 1;
  iVar4 = (*root->_vptr_IRNode[1])(root);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    uVar8 = 0;
    do {
      iVar4 = (*root->_vptr_IRNode[2])(root,uVar8);
      local_38 = (_Hash_node_base *)CONCAT44(extraout_var_00,iVar4);
      uVar1 = (this->visited_)._M_h._M_bucket_count;
      uVar6 = (ulong)local_38 % uVar1;
      p_Var2 = (this->visited_)._M_h._M_buckets[uVar6];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var2, p_Var7 = p_Var2->_M_nxt, local_38 != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar6) ||
             (p_Var5 = p_Var7, p_Var7 = p_Var3, local_38 == p_Var3[1]._M_nxt)) goto LAB_001acc73;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_001acc73:
      if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
        pVar9 = std::
                _Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_M_emplace<kratos::IRNode*&>
                          ((_Hashtable<kratos::IRNode*,kratos::IRNode*,std::allocator<kratos::IRNode*>,std::__detail::_Identity,std::equal_to<kratos::IRNode*>,std::hash<kratos::IRNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&this->visited_,&local_38);
        (**this->_vptr_IRVisitor)(this,local_38,pVar9._8_8_);
      }
      iVar4 = (*root->_vptr_IRNode[1])(root);
      p_Var3 = local_38;
      if (uVar8 < CONCAT44(extraout_var_01,iVar4)) {
        iVar4 = (*root->_vptr_IRNode[2])(root,uVar8);
        uVar8 = uVar8 + (p_Var3 == (_Hash_node_base *)CONCAT44(extraout_var_02,iVar4));
      }
      iVar4 = (*root->_vptr_IRNode[1])(root);
    } while (uVar8 < CONCAT44(extraout_var_03,iVar4));
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void IRVisitor::visit_root(IRNode *root) {
    // recursively call visits
    root->accept(this);
    level++;
    uint64_t count = 0;
    while (count < root->child_count()) {
        auto *child = root->get_child(count);
        if (visited_.find(child) == visited_.end()) {
            visited_.emplace(child);
            visit_root(child);
        }
        if (count < root->child_count() && child == root->get_child(count)) {
            count++;
        }
    }
    level--;
}